

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles3::Functional::TriangleDerivateCase::getSurfaceThreshold(TriangleDerivateCase *this)

{
  int iVar1;
  undefined4 x_;
  undefined4 z_;
  undefined4 y_;
  undefined4 w_;
  RenderTarget *this_00;
  PixelFormat *pPVar2;
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar3;
  Vec4 VVar4;
  Vector<int,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<int,_4> local_68;
  Vector<int,_4> local_58;
  tcu local_48 [8];
  IVec4 intThreshold;
  IVec4 channelBits;
  PixelFormat pixelFormat;
  TriangleDerivateCase *this_local;
  Vec4 *normThreshold;
  undefined1 auVar5 [12];
  undefined8 uVar6;
  
  iVar1 = *(int *)(in_RSI + 0xe8);
  if (iVar1 == 0) {
    this_00 = gles3::Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
    pPVar2 = tcu::RenderTarget::getPixelFormat(this_00);
    x_ = pPVar2->redBits;
    y_ = pPVar2->greenBits;
    z_ = pPVar2->blueBits;
    w_ = pPVar2->alphaBits;
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(intThreshold.m_data + 2),x_,y_,z_,w_);
    tcu::Vector<int,_4>::Vector(&local_58,1);
    tcu::operator-((tcu *)&local_68,8,(Vector<int,_4> *)(intThreshold.m_data + 2));
    tcu::operator<<(local_48,&local_58,&local_68);
    tcu::Vector<int,_4>::asFloat((Vector<int,_4> *)&local_78);
    VVar3 = tcu::operator/((tcu *)this,&local_78,255.0);
  }
  else if (iVar1 == 1) {
    tcu::Vector<int,_4>::Vector(&local_98,1);
    tcu::Vector<int,_4>::asFloat((Vector<int,_4> *)&local_88);
    VVar3 = tcu::operator/((tcu *)this,&local_88,255.0);
  }
  else if (iVar1 == 2) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar3.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar3.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa_00;
    VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  }
  VVar4.m_data[0] = VVar3.m_data[0];
  auVar5._4_4_ = VVar3.m_data[1];
  register0x00001240 = VVar3.m_data[2];
  register0x00001244 = VVar3.m_data[3];
  return (Vec4)VVar4.m_data;
}

Assistant:

tcu::Vec4 TriangleDerivateCase::getSurfaceThreshold (void) const
{
	switch (m_surfaceType)
	{
		case SURFACETYPE_DEFAULT_FRAMEBUFFER:
		{
			const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			const tcu::IVec4		channelBits		(pixelFormat.redBits, pixelFormat.greenBits, pixelFormat.blueBits, pixelFormat.alphaBits);
			const tcu::IVec4		intThreshold	= tcu::IVec4(1) << (8 - channelBits);
			const tcu::Vec4			normThreshold	= intThreshold.asFloat() / 255.0f;

			return normThreshold;
		}

		case SURFACETYPE_UNORM_FBO:				return tcu::IVec4(1).asFloat() / 255.0f;
		case SURFACETYPE_FLOAT_FBO:				return tcu::Vec4(0.0f);
		default:
			DE_ASSERT(false);
			return tcu::Vec4(0.0f);
	}
}